

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::MultipoleAdapter::makeMultipole
          (MultipoleAdapter *this,Vector3d *dipole,Mat3x3d *quadrupole,bool isDipole,
          bool isQuadrupole)

{
  AtomType *this_00;
  bool bVar1;
  MultipoleAtypeParameters multipoleParam;
  undefined1 local_b8 [32];
  undefined2 local_98;
  Vector<double,_3U> local_90;
  RectMatrix<double,_3U,_3U> local_78;
  
  bVar1 = isMultipole(this);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)MultipoleTypeID_abi_cxx11_);
  }
  local_98 = 0;
  Vector<double,_3U>::Vector(&local_90);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_78);
  Vector<double,_3U>::operator=(&local_90,&dipole->super_Vector<double,_3U>);
  RectMatrix<double,_3U,_3U>::operator=(&local_78,(RectMatrix<double,_3U,_3U> *)quadrupole);
  local_98 = CONCAT11(isQuadrupole,isDipole);
  this_00 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::MultipoleAtypeParameters>,std::__cxx11::string_const&,OpenMD::MultipoleAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
             (MultipoleAtypeParameters *)MultipoleTypeID_abi_cxx11_);
  local_b8._16_8_ = local_b8._0_8_;
  local_b8._24_8_ = local_b8._8_8_;
  local_b8._0_8_ = (pointer)0x0;
  local_b8._8_8_ = 0;
  AtomType::addProperty(this_00,(shared_ptr<OpenMD::GenericData> *)(local_b8 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  return;
}

Assistant:

void MultipoleAdapter::makeMultipole(Vector3d dipole, Mat3x3d quadrupole,
                                       bool isDipole, bool isQuadrupole) {
    if (isMultipole()) { at_->removeProperty(MultipoleTypeID); }

    MultipoleAtypeParameters multipoleParam {};

    multipoleParam.dipole     = dipole;
    multipoleParam.quadrupole = quadrupole;

    multipoleParam.isDipole     = isDipole;
    multipoleParam.isQuadrupole = isQuadrupole;

    at_->addProperty(
        std::make_shared<MultipoleAtypeData>(MultipoleTypeID, multipoleParam));
  }